

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_type sVar6;
  result *prVar7;
  ostream *poVar8;
  int *value;
  int *value_00;
  ostringstream os_1;
  ostringstream os;
  string local_430;
  size_type *local_410;
  size_type local_408;
  size_type local_400;
  undefined8 uStack_3f8;
  long *local_3f0;
  long local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  undefined8 uStack_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  result *local_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  undefined8 uStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  size_type *local_368;
  size_type local_360;
  size_type local_358;
  undefined8 uStack_350;
  bool local_348;
  long *local_340;
  long local_338;
  long local_330 [2];
  string local_320 [3];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar5 = *(long *)this;
  iVar4 = *(int *)(lVar5 + 4);
  iVar3 = *rhs;
  local_3f0 = (long *)&local_3e0;
  local_3b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"==","");
  local_3a8 = &local_398;
  if (local_3f0 == (long *)&local_3e0) {
    uStack_390 = uStack_3d8;
  }
  else {
    local_3a8 = local_3f0;
  }
  local_398 = CONCAT71(uStack_3df,local_3e0);
  local_3a0 = local_3e8;
  local_3e8 = 0;
  local_3e0 = 0;
  local_3f0 = (long *)&local_3e0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  puVar2 = (uint *)((long)&local_320[0].field_2 +
                   *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar2 = *puVar2 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"[V:",3);
  string_maker<int>::to_string_abi_cxx11_(&local_430,(string_maker<int> *)(lVar5 + 4),value);
  paVar1 = &local_430.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == paVar1) {
    uStack_3f8 = local_430.field_2._8_8_;
    local_410 = &local_400;
  }
  else {
    local_410 = (size_type *)local_430._M_dataplus._M_p;
  }
  local_400 = local_430.field_2._M_allocated_capacity;
  local_408 = local_430._M_string_length;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(char *)local_410,local_430._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == paVar1) {
    uStack_3f8 = local_430.field_2._8_8_;
    local_410 = &local_400;
  }
  else {
    local_410 = (size_type *)local_430._M_dataplus._M_p;
  }
  local_400 = local_430.field_2._M_allocated_capacity;
  local_408 = local_430._M_string_length;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_410 == &local_400) {
    uStack_350 = uStack_3f8;
    local_368 = &local_358;
  }
  else {
    local_368 = local_410;
  }
  local_358 = local_400;
  local_360 = local_408;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_368,local_408);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3a8,local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  string_maker<int>::to_string_abi_cxx11_(local_320,(string_maker<int> *)rhs,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p == &local_320[0].field_2) {
    local_430.field_2._8_8_ = local_320[0].field_2._8_8_;
    local_430._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_430._M_dataplus._M_p = local_320[0]._M_dataplus._M_p;
  }
  local_430.field_2._M_allocated_capacity = local_320[0].field_2._M_allocated_capacity;
  local_430._M_string_length = local_320[0]._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,local_430._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  std::__cxx11::ostringstream::str();
  prVar7 = local_3b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p == &local_320[0].field_2) {
    local_3c0._8_8_ = local_320[0].field_2._8_8_;
    local_3d0 = &local_3c0;
  }
  else {
    local_3d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320[0]._M_dataplus._M_p;
  }
  local_3c0._M_allocated_capacity = local_320[0].field_2._M_allocated_capacity;
  local_3c8 = local_320[0]._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  sVar6 = local_3c8;
  if (local_3d0 == &local_3c0) {
    local_378._8_4_ = local_3c0._8_4_;
    local_378._12_4_ = local_3c0._12_4_;
    local_388 = &local_378;
  }
  else {
    local_388 = local_3d0;
  }
  local_378._M_allocated_capacity = local_3c0._M_allocated_capacity;
  local_380 = local_3c8;
  local_3c8 = 0;
  local_3c0._M_allocated_capacity = local_3c0._M_allocated_capacity & 0xffffffffffffff00;
  local_3d0 = &local_3c0;
  local_348 = iVar4 == iVar3;
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,local_388,local_388->_M_local_buf + sVar6);
  prVar7->passed = local_348;
  (prVar7->decomposition)._M_dataplus._M_p = (pointer)&(prVar7->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&prVar7->decomposition,local_340,local_338 + (long)local_340);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378._M_allocated_capacity + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0._M_allocated_capacity + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  if (local_3f0 != (long *)&local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  return prVar7;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }